

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uchar fts5yy_reduce(fts5yyParser *fts5yypParser,uint fts5yyruleno,int fts5yyLookahead,
                   Fts5Token fts5yyLookaheadToken)

{
  uchar uVar1;
  int iVar2;
  Fts5ExprNode *pExpr;
  Fts5Colset *pFVar3;
  Fts5ExprNode *pFVar4;
  Fts5ExprNearset *pFVar5;
  Fts5ExprPhrase *pFVar6;
  undefined4 in_EDX;
  uint in_ESI;
  Fts5Parse *in_RDI;
  Fts5Parse *pParse;
  int fts5yysize;
  fts5yyStackEntry *fts5yymsp;
  uchar fts5yyact;
  int fts5yygoto;
  Fts5Parse *in_stack_ffffffffffffffb0;
  Fts5ExprNearset *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  Fts5Config *pFVar7;
  undefined3 in_stack_ffffffffffffffd8;
  undefined4 uVar8;
  uchar iLookAhead;
  undefined4 uVar9;
  
  uVar9 = 0xaaaaaaaa;
  uVar8 = CONCAT13(0xaa,in_stack_ffffffffffffffd8);
  pFVar4 = (Fts5ExprNode *)in_RDI->zErr;
  pFVar7 = in_RDI->pConfig;
  pExpr = (Fts5ExprNode *)(ulong)in_ESI;
  switch(pExpr) {
  case (Fts5ExprNode *)0x0:
    sqlite3Fts5ParseFinished
              ((Fts5Parse *)pFVar4,(Fts5ExprNode *)((Fts5Buffer *)&pFVar7->pGlobal)->p);
    break;
  case (Fts5ExprNode *)0x1:
    pFVar3 = sqlite3Fts5ParseColsetInvert
                       ((Fts5Parse *)pFVar4,(Fts5Colset *)in_stack_ffffffffffffffb8);
    *(Fts5Colset **)&pFVar7[-1].iCookie = pFVar3;
    break;
  case (Fts5ExprNode *)0x2:
    pFVar7[-1].zRank = *(char **)&pFVar7[-1].bPrefixInsttoken;
    break;
  case (Fts5ExprNode *)0x3:
    pFVar3 = sqlite3Fts5ParseColset
                       ((Fts5Parse *)pFVar7,
                        (Fts5Colset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                        (Fts5Token *)pFVar4);
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = (u8 *)pFVar3;
    break;
  case (Fts5ExprNode *)0x4:
    pFVar3 = sqlite3Fts5ParseColset
                       ((Fts5Parse *)pFVar7,
                        (Fts5Colset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                        (Fts5Token *)pFVar4);
    *(Fts5Colset **)&pFVar7[-1].bPrefixInsttoken = pFVar3;
    pFVar3 = sqlite3Fts5ParseColsetInvert
                       ((Fts5Parse *)pFVar4,(Fts5Colset *)in_stack_ffffffffffffffb8);
    *(Fts5Colset **)&pFVar7[-1].bPrefixInsttoken = pFVar3;
    break;
  case (Fts5ExprNode *)0x5:
    pFVar3 = sqlite3Fts5ParseColset
                       ((Fts5Parse *)pFVar7,
                        (Fts5Colset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                        (Fts5Token *)pFVar4);
    *(Fts5Colset **)&pFVar7[-1].bPrefixInsttoken = pFVar3;
    break;
  case (Fts5ExprNode *)0x6:
    pFVar3 = sqlite3Fts5ParseColset
                       ((Fts5Parse *)pFVar7,
                        (Fts5Colset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),
                        (Fts5Token *)pFVar4);
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = (u8 *)pFVar3;
    break;
  case (Fts5ExprNode *)0x7:
    pFVar4 = sqlite3Fts5ParseNode
                       (in_RDI,in_ESI,(Fts5ExprNode *)CONCAT44(0xaaaaaaaa,uVar8),
                        (Fts5ExprNode *)pFVar7,
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    pFVar7[-1].zRank = (char *)pFVar4;
    break;
  case (Fts5ExprNode *)0x8:
    pFVar4 = sqlite3Fts5ParseNode
                       (in_RDI,in_ESI,(Fts5ExprNode *)CONCAT44(0xaaaaaaaa,uVar8),
                        (Fts5ExprNode *)pFVar7,
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    pFVar7[-1].zRank = (char *)pFVar4;
    break;
  case (Fts5ExprNode *)0x9:
    pFVar4 = sqlite3Fts5ParseNode
                       (in_RDI,in_ESI,(Fts5ExprNode *)CONCAT44(0xaaaaaaaa,uVar8),
                        (Fts5ExprNode *)pFVar7,
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    pFVar7[-1].zRank = (char *)pFVar4;
    break;
  case (Fts5ExprNode *)0xa:
    sqlite3Fts5ParseSetColset(in_stack_ffffffffffffffb0,pExpr,(Fts5Colset *)0x26d893);
    pFVar7[-1].t.pLocale = *(char **)&pFVar7[-1].bPrefixInsttoken;
    break;
  case (Fts5ExprNode *)0xb:
    pFVar7[-1].zRank = *(char **)&pFVar7[-1].bPrefixInsttoken;
    break;
  case (Fts5ExprNode *)0xc:
  case (Fts5ExprNode *)0xd:
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = ((Fts5Buffer *)&pFVar7->pGlobal)->p;
    break;
  case (Fts5ExprNode *)0xe:
    pFVar4 = sqlite3Fts5ParseImplicitAnd
                       ((Fts5Parse *)pFVar7,
                        (Fts5ExprNode *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8),pFVar4);
    *(Fts5ExprNode **)&pFVar7[-1].bPrefixInsttoken = pFVar4;
    break;
  case (Fts5ExprNode *)0xf:
    pFVar4 = sqlite3Fts5ParseNode
                       (in_RDI,in_ESI,(Fts5ExprNode *)CONCAT44(0xaaaaaaaa,uVar8),
                        (Fts5ExprNode *)pFVar7,
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = (u8 *)pFVar4;
    break;
  case (Fts5ExprNode *)0x10:
    pFVar4 = sqlite3Fts5ParseNode
                       (in_RDI,in_ESI,(Fts5ExprNode *)CONCAT44(0xaaaaaaaa,uVar8),
                        (Fts5ExprNode *)pFVar7,
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffc8));
    sqlite3Fts5ParseSetColset((Fts5Parse *)pFVar4,pExpr,(Fts5Colset *)0x26d993);
    pFVar7[-1].zRank = (char *)pFVar4;
    break;
  case (Fts5ExprNode *)0x11:
    pFVar5 = sqlite3Fts5ParseNearset
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,uVar8),(Fts5ExprPhrase *)pFVar7);
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = (u8 *)pFVar5;
    break;
  case (Fts5ExprNode *)0x12:
    sqlite3Fts5ParseSetCaret((Fts5ExprPhrase *)((Fts5Buffer *)&pFVar7->pGlobal)->p);
    pFVar5 = sqlite3Fts5ParseNearset
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprNearset *)CONCAT44(uVar9,uVar8),(Fts5ExprPhrase *)pFVar7);
    *(Fts5ExprNearset **)&pFVar7[-1].bPrefixInsttoken = pFVar5;
    break;
  case (Fts5ExprNode *)0x13:
    sqlite3Fts5ParseNear(in_stack_ffffffffffffffb0,(Fts5Token *)pExpr);
    sqlite3Fts5ParseSetDistance
              ((Fts5Parse *)pFVar4,in_stack_ffffffffffffffb8,(Fts5Token *)in_stack_ffffffffffffffb0)
    ;
    pFVar7[-1].t.pLocale = pFVar7[-1].zRank;
    break;
  case (Fts5ExprNode *)0x14:
    pFVar5 = sqlite3Fts5ParseNearset
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,uVar8),(Fts5ExprPhrase *)pFVar7);
    ((Fts5Buffer *)&pFVar7->pGlobal)->p = (u8 *)pFVar5;
    break;
  case (Fts5ExprNode *)0x15:
    pFVar5 = sqlite3Fts5ParseNearset
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprNearset *)CONCAT44(0xaaaaaaaa,uVar8),(Fts5ExprPhrase *)pFVar7);
    *(Fts5ExprNearset **)&pFVar7[-1].bPrefixInsttoken = pFVar5;
    break;
  case (Fts5ExprNode *)0x16:
    *(u8 *)&pFVar7->nCol = '\0';
    *(u8 *)((long)&pFVar7->nCol + 1) = '\0';
    *(undefined6 *)&pFVar7->nCol = 0;
    *(undefined4 *)&pFVar7->azCol = 0;
    break;
  case (Fts5ExprNode *)0x17:
    *(u8 **)&pFVar7[-1].bPrefixInsttoken = ((Fts5Buffer *)&pFVar7->pGlobal)->p;
    pFVar7[-1].pzErrmsg = (char **)pFVar7->zDb;
    break;
  case (Fts5ExprNode *)0x18:
    pFVar6 = sqlite3Fts5ParseTerm
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprPhrase *)CONCAT44(0xaaaaaaaa,uVar8),(Fts5Token *)pFVar7,-0x55555556
                       );
    *(Fts5ExprPhrase **)&pFVar7[-1].iCookie = pFVar6;
    break;
  case (Fts5ExprNode *)0x19:
    pFVar6 = sqlite3Fts5ParseTerm
                       ((Fts5Parse *)CONCAT44(in_ESI,in_EDX),
                        (Fts5ExprPhrase *)CONCAT44(0xaaaaaaaa,uVar8),(Fts5Token *)pFVar7,-0x55555556
                       );
    *(Fts5ExprPhrase **)&pFVar7[-1].bPrefixInsttoken = pFVar6;
    break;
  case (Fts5ExprNode *)0x1a:
    *(undefined4 *)&((Fts5Buffer *)&pFVar7->pGlobal)->p = 1;
    break;
  case (Fts5ExprNode *)0x1b:
    *(u8 *)&pFVar7->nCol = '\0';
    *(u8 *)((long)&pFVar7->nCol + 1) = '\0';
    *(undefined2 *)((long)&pFVar7->nCol + 2) = 0;
  }
  iLookAhead = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
               [in_ESI];
  iVar2 = (int)fts5yyRuleInfoNRhs[in_ESI];
  uVar1 = fts5yy_find_reduce_action(*(uchar *)(&pFVar7->db + (long)iVar2 * 3),iLookAhead);
  pFVar7 = (Fts5Config *)(&pFVar7->db + (long)(iVar2 + 1) * 3);
  in_RDI->pConfig = pFVar7;
  *(uchar *)&pFVar7->db = uVar1;
  *(uchar *)((long)&pFVar7->db + 1) = iLookAhead;
  return uVar1;
}

Assistant:

static fts5YYACTIONTYPE fts5yy_reduce(
  fts5yyParser *fts5yypParser,         /* The parser */
  unsigned int fts5yyruleno,       /* Number of the rule by which to reduce */
  int fts5yyLookahead,             /* Lookahead token, or fts5YYNOCODE if none */
  sqlite3Fts5ParserFTS5TOKENTYPE fts5yyLookaheadToken  /* Value of the lookahead token */
  sqlite3Fts5ParserCTX_PDECL                   /* %extra_context */
){
  int fts5yygoto;                     /* The next state */
  fts5YYACTIONTYPE fts5yyact;             /* The next action */
  fts5yyStackEntry *fts5yymsp;            /* The top of the parser's stack */
  int fts5yysize;                     /* Amount to pop the stack */
  sqlite3Fts5ParserARG_FETCH
  (void)fts5yyLookahead;
  (void)fts5yyLookaheadToken;
  fts5yymsp = fts5yypParser->fts5yytos;

  switch( fts5yyruleno ){
  /* Beginning here are the reduction cases.  A typical example
  ** follows:
  **   case 0:
  **  #line <lineno> <grammarfile>
  **     { ... }           // User supplied code
  **  #line <lineno> <thisfile>
  **     break;
  */
/********** Begin reduce actions **********************************************/
        fts5YYMINORTYPE fts5yylhsminor;
      case 0: /* input ::= expr */
{ sqlite3Fts5ParseFinished(pParse, fts5yymsp[0].minor.fts5yy24); }
        break;
      case 1: /* colset ::= MINUS LCP colsetlist RCP */
{
    fts5yymsp[-3].minor.fts5yy11 = sqlite3Fts5ParseColsetInvert(pParse, fts5yymsp[-1].minor.fts5yy11);
}
        break;
      case 2: /* colset ::= LCP colsetlist RCP */
{ fts5yymsp[-2].minor.fts5yy11 = fts5yymsp[-1].minor.fts5yy11; }
        break;
      case 3: /* colset ::= STRING */
{
  fts5yylhsminor.fts5yy11 = sqlite3Fts5ParseColset(pParse, 0, &fts5yymsp[0].minor.fts5yy0);
}
  fts5yymsp[0].minor.fts5yy11 = fts5yylhsminor.fts5yy11;
        break;
      case 4: /* colset ::= MINUS STRING */
{
  fts5yymsp[-1].minor.fts5yy11 = sqlite3Fts5ParseColset(pParse, 0, &fts5yymsp[0].minor.fts5yy0);
  fts5yymsp[-1].minor.fts5yy11 = sqlite3Fts5ParseColsetInvert(pParse, fts5yymsp[-1].minor.fts5yy11);
}
        break;
      case 5: /* colsetlist ::= colsetlist STRING */
{
  fts5yylhsminor.fts5yy11 = sqlite3Fts5ParseColset(pParse, fts5yymsp[-1].minor.fts5yy11, &fts5yymsp[0].minor.fts5yy0); }
  fts5yymsp[-1].minor.fts5yy11 = fts5yylhsminor.fts5yy11;
        break;
      case 6: /* colsetlist ::= STRING */
{
  fts5yylhsminor.fts5yy11 = sqlite3Fts5ParseColset(pParse, 0, &fts5yymsp[0].minor.fts5yy0);
}
  fts5yymsp[0].minor.fts5yy11 = fts5yylhsminor.fts5yy11;
        break;
      case 7: /* expr ::= expr AND expr */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseNode(pParse, FTS5_AND, fts5yymsp[-2].minor.fts5yy24, fts5yymsp[0].minor.fts5yy24, 0);
}
  fts5yymsp[-2].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 8: /* expr ::= expr OR expr */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseNode(pParse, FTS5_OR, fts5yymsp[-2].minor.fts5yy24, fts5yymsp[0].minor.fts5yy24, 0);
}
  fts5yymsp[-2].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 9: /* expr ::= expr NOT expr */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseNode(pParse, FTS5_NOT, fts5yymsp[-2].minor.fts5yy24, fts5yymsp[0].minor.fts5yy24, 0);
}
  fts5yymsp[-2].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 10: /* expr ::= colset COLON LP expr RP */
{
  sqlite3Fts5ParseSetColset(pParse, fts5yymsp[-1].minor.fts5yy24, fts5yymsp[-4].minor.fts5yy11);
  fts5yylhsminor.fts5yy24 = fts5yymsp[-1].minor.fts5yy24;
}
  fts5yymsp[-4].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 11: /* expr ::= LP expr RP */
{fts5yymsp[-2].minor.fts5yy24 = fts5yymsp[-1].minor.fts5yy24;}
        break;
      case 12: /* expr ::= exprlist */
      case 13: /* exprlist ::= cnearset */ fts5yytestcase(fts5yyruleno==13);
{fts5yylhsminor.fts5yy24 = fts5yymsp[0].minor.fts5yy24;}
  fts5yymsp[0].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 14: /* exprlist ::= exprlist cnearset */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseImplicitAnd(pParse, fts5yymsp[-1].minor.fts5yy24, fts5yymsp[0].minor.fts5yy24);
}
  fts5yymsp[-1].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 15: /* cnearset ::= nearset */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseNode(pParse, FTS5_STRING, 0, 0, fts5yymsp[0].minor.fts5yy46);
}
  fts5yymsp[0].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 16: /* cnearset ::= colset COLON nearset */
{
  fts5yylhsminor.fts5yy24 = sqlite3Fts5ParseNode(pParse, FTS5_STRING, 0, 0, fts5yymsp[0].minor.fts5yy46);
  sqlite3Fts5ParseSetColset(pParse, fts5yylhsminor.fts5yy24, fts5yymsp[-2].minor.fts5yy11);
}
  fts5yymsp[-2].minor.fts5yy24 = fts5yylhsminor.fts5yy24;
        break;
      case 17: /* nearset ::= phrase */
{ fts5yylhsminor.fts5yy46 = sqlite3Fts5ParseNearset(pParse, 0, fts5yymsp[0].minor.fts5yy53); }
  fts5yymsp[0].minor.fts5yy46 = fts5yylhsminor.fts5yy46;
        break;
      case 18: /* nearset ::= CARET phrase */
{
  sqlite3Fts5ParseSetCaret(fts5yymsp[0].minor.fts5yy53);
  fts5yymsp[-1].minor.fts5yy46 = sqlite3Fts5ParseNearset(pParse, 0, fts5yymsp[0].minor.fts5yy53);
}
        break;
      case 19: /* nearset ::= STRING LP nearphrases neardist_opt RP */
{
  sqlite3Fts5ParseNear(pParse, &fts5yymsp[-4].minor.fts5yy0);
  sqlite3Fts5ParseSetDistance(pParse, fts5yymsp[-2].minor.fts5yy46, &fts5yymsp[-1].minor.fts5yy0);
  fts5yylhsminor.fts5yy46 = fts5yymsp[-2].minor.fts5yy46;
}
  fts5yymsp[-4].minor.fts5yy46 = fts5yylhsminor.fts5yy46;
        break;
      case 20: /* nearphrases ::= phrase */
{
  fts5yylhsminor.fts5yy46 = sqlite3Fts5ParseNearset(pParse, 0, fts5yymsp[0].minor.fts5yy53);
}
  fts5yymsp[0].minor.fts5yy46 = fts5yylhsminor.fts5yy46;
        break;
      case 21: /* nearphrases ::= nearphrases phrase */
{
  fts5yylhsminor.fts5yy46 = sqlite3Fts5ParseNearset(pParse, fts5yymsp[-1].minor.fts5yy46, fts5yymsp[0].minor.fts5yy53);
}
  fts5yymsp[-1].minor.fts5yy46 = fts5yylhsminor.fts5yy46;
        break;
      case 22: /* neardist_opt ::= */
{ fts5yymsp[1].minor.fts5yy0.p = 0; fts5yymsp[1].minor.fts5yy0.n = 0; }
        break;
      case 23: /* neardist_opt ::= COMMA STRING */
{ fts5yymsp[-1].minor.fts5yy0 = fts5yymsp[0].minor.fts5yy0; }
        break;
      case 24: /* phrase ::= phrase PLUS STRING star_opt */
{
  fts5yylhsminor.fts5yy53 = sqlite3Fts5ParseTerm(pParse, fts5yymsp[-3].minor.fts5yy53, &fts5yymsp[-1].minor.fts5yy0, fts5yymsp[0].minor.fts5yy4);
}
  fts5yymsp[-3].minor.fts5yy53 = fts5yylhsminor.fts5yy53;
        break;
      case 25: /* phrase ::= STRING star_opt */
{
  fts5yylhsminor.fts5yy53 = sqlite3Fts5ParseTerm(pParse, 0, &fts5yymsp[-1].minor.fts5yy0, fts5yymsp[0].minor.fts5yy4);
}
  fts5yymsp[-1].minor.fts5yy53 = fts5yylhsminor.fts5yy53;
        break;
      case 26: /* star_opt ::= STAR */
{ fts5yymsp[0].minor.fts5yy4 = 1; }
        break;
      case 27: /* star_opt ::= */
{ fts5yymsp[1].minor.fts5yy4 = 0; }
        break;
      default:
        break;
/********** End reduce actions ************************************************/
  };
  assert( fts5yyruleno<sizeof(fts5yyRuleInfoLhs)/sizeof(fts5yyRuleInfoLhs[0]) );
  fts5yygoto = fts5yyRuleInfoLhs[fts5yyruleno];
  fts5yysize = fts5yyRuleInfoNRhs[fts5yyruleno];
  fts5yyact = fts5yy_find_reduce_action(fts5yymsp[fts5yysize].stateno,(fts5YYCODETYPE)fts5yygoto);

  /* There are no SHIFTREDUCE actions on nonterminals because the table
  ** generator has simplified them to pure REDUCE actions. */
  assert( !(fts5yyact>fts5YY_MAX_SHIFT && fts5yyact<=fts5YY_MAX_SHIFTREDUCE) );

  /* It is not possible for a REDUCE to be followed by an error */
  assert( fts5yyact!=fts5YY_ERROR_ACTION );

  fts5yymsp += fts5yysize+1;
  fts5yypParser->fts5yytos = fts5yymsp;
  fts5yymsp->stateno = (fts5YYACTIONTYPE)fts5yyact;
  fts5yymsp->major = (fts5YYCODETYPE)fts5yygoto;
  fts5yyTraceShift(fts5yypParser, fts5yyact, "... then shift");
  return fts5yyact;
}